

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindow.cpp
# Opt level: O1

QPoint __thiscall QWindow::framePosition(QWindow *this)

{
  long lVar1;
  QPoint QVar2;
  long in_FS_OFFSET;
  QMargins QVar3;
  QPoint local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&this->field_0x8;
  if (*(long *)(lVar1 + 0x88) == 0) {
    QVar2 = *(QPoint *)(lVar1 + 0xd8);
  }
  else {
    QVar3 = frameMargins(this);
    local_28 = (QPoint)(**(code **)(**(long **)(lVar1 + 0x88) + 0x30))();
    QVar2 = QHighDpi::fromNativeWindowGeometry<QPoint,QWindow>(&local_28,this);
    QVar2 = (QPoint)((ulong)(uint)(QVar2.xp.m_i.m_i - QVar3.m_left.m_i) |
                    (long)QVar2 - (QVar3._0_8_ & 0xffffffff00000000) & 0xffffffff00000000);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QPoint QWindow::framePosition() const
{
    Q_D(const QWindow);
    if (d->platformWindow) {
        QMargins margins = frameMargins();
        return QHighDpi::fromNativeWindowGeometry(d->platformWindow->geometry().topLeft(), this) - QPoint(margins.left(), margins.top());
    }
    return d->geometry.topLeft();
}